

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_2::verifyImageWithVerifier
               (Surface *resultImage,TestLog *log,Verifier *verifier,bool logOnSuccess)

{
  ostringstream *this;
  TextureFormat TVar1;
  TextureFormat TVar2;
  int iVar3;
  TestLog *pTVar4;
  undefined7 in_register_00000009;
  ConstPixelBufferAccess *pCVar5;
  Surface *__n;
  LogImageSet *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int x;
  ChannelOrder CVar6;
  int y;
  ChannelType CVar7;
  bool bVar8;
  allocator<char> local_45a;
  allocator<char> local_459;
  allocator<char> local_458;
  allocator<char> local_457;
  allocator<char> local_456;
  allocator<char> local_455;
  undefined4 local_454;
  Surface *local_450;
  TextureFormat local_448;
  string local_440;
  undefined1 local_420 [32];
  Surface errorMask;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  ConstPixelBufferAccess local_368;
  ConstPixelBufferAccess local_340;
  LogImageSet local_318;
  RGBA color;
  float fStack_2d4;
  LogImage local_240;
  undefined1 local_1b0 [384];
  
  local_450 = resultImage;
  tcu::Surface::Surface(&errorMask,resultImage->m_width,resultImage->m_height);
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&errorMask);
  _color = (pointer)0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&color);
  if (logOnSuccess) {
    this = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Verifying image.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    (*verifier->_vptr_Verifier[1])(verifier,log);
  }
  local_454 = (undefined4)CONCAT71(in_register_00000009,logOnSuccess);
  bVar8 = false;
  __n = local_450;
  local_448 = (TextureFormat)log;
  for (CVar7 = SNORM_INT8; TVar1 = local_448, (int)CVar7 < __n->m_height;
      CVar7 = CVar7 + SNORM_INT16) {
    for (CVar6 = R; (int)CVar6 < __n->m_width; CVar6 = CVar6 + A) {
      color.m_value =
           (deUint32)
           *(float *)((long)(__n->m_pixels).m_ptr + (long)(int)(__n->m_width * CVar7 + CVar6) * 4);
      local_1b0._4_4_ = CVar7;
      local_1b0._0_4_ = CVar6;
      iVar3 = (**verifier->_vptr_Verifier)(verifier,&color,local_1b0);
      if ((char)iVar3 == '\0') {
        *(undefined4 *)
         ((long)errorMask.m_pixels.m_ptr + (long)(int)(errorMask.m_width * CVar7 + CVar6) * 4) =
             0xff0000ff;
        bVar8 = true;
      }
      __n = local_450;
    }
  }
  if (bVar8) {
    if ((char)local_454 == '\0') {
      (*verifier->_vptr_Verifier[1])(verifier,local_448);
    }
    TVar2 = local_448;
    local_448.order = TVar1.order;
    local_448.type = TVar1.type;
    local_1b0._0_4_ = local_448.order;
    local_1b0._4_4_ = local_448.type;
    local_448 = TVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Image verification failed.");
    pTVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_420,"Verification",&local_455);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"Image Verification",&local_456);
    tcu::LogImageSet::LogImageSet(&local_318,(string *)local_420,&local_440);
    iVar3 = (int)pTVar4;
    tcu::LogImageSet::write(&local_318,iVar3,__buf,(size_t)__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"Result",&local_457);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"Result image",&local_458);
    tcu::Surface::getAccess(&local_340,local_450);
    pCVar5 = &local_340;
    tcu::LogImage::LogImage
              ((LogImage *)&color,&local_388,&local_3a8,pCVar5,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&color,iVar3,__buf_00,(size_t)pCVar5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"ErrorMask",&local_459);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"Error Mask",&local_45a)
    ;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_368,&errorMask);
    pCVar5 = &local_368;
    tcu::LogImage::LogImage(&local_240,&local_3c8,&local_3e8,pCVar5,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_240,iVar3,__buf_01,(size_t)pCVar5);
    tcu::TestLog::endImageSet(pTVar4);
    tcu::LogImage::~LogImage(&local_240);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    tcu::LogImage::~LogImage((LogImage *)&color);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_388);
    tcu::LogImageSet::~LogImageSet(&local_318);
    std::__cxx11::string::~string((string *)&local_440);
    pCVar5 = (ConstPixelBufferAccess *)local_420;
  }
  else {
    if ((char)local_454 == '\0') goto LAB_0122e3f0;
    local_1b0._0_4_ = local_448.order;
    local_1b0._4_4_ = local_448.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Image verification passed.");
    pTVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"Verification",(allocator<char> *)&local_388);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"Image Verification",(allocator<char> *)&local_3a8);
    tcu::LogImageSet::LogImageSet
              ((LogImageSet *)&local_240,(string *)&local_340,(string *)&local_368);
    tcu::LogImageSet::write((LogImageSet *)&local_240,(int)pTVar4,__buf_02,(size_t)__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_420,"Result",(allocator<char> *)&local_3c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"Result image",(allocator<char> *)&local_3e8);
    tcu::Surface::getAccess((ConstPixelBufferAccess *)&local_318,local_450);
    access = &local_318;
    tcu::LogImage::LogImage
              ((LogImage *)&color,(string *)local_420,&local_440,(ConstPixelBufferAccess *)access,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&color,(int)pTVar4,__buf_03,(size_t)access);
    tcu::TestLog::endImageSet(pTVar4);
    tcu::LogImage::~LogImage((LogImage *)&color);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)local_420);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_240);
    std::__cxx11::string::~string((string *)&local_368);
    pCVar5 = &local_340;
  }
  std::__cxx11::string::~string((string *)pCVar5);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
LAB_0122e3f0:
  tcu::Surface::~Surface(&errorMask);
  return (bool)(~bVar8 & 1);
}

Assistant:

static bool verifyImageWithVerifier (const tcu::Surface& resultImage, tcu::TestLog& log, const Verifier& verifier, bool logOnSuccess = true)
{
	tcu::Surface	errorMask	(resultImage.getWidth(), resultImage.getHeight());
	bool			error		= false;

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	if (logOnSuccess)
	{
		log << tcu::TestLog::Message << "Verifying image." << tcu::TestLog::EndMessage;
		verifier.logInfo(log);
	}

	for (int y = 0; y < resultImage.getHeight(); ++y)
	for (int x = 0; x < resultImage.getWidth(); ++x)
	{
		const tcu::RGBA color		= resultImage.getPixel(x, y);

		// verify color value is valid for this pixel position
		if (!verifier.verify(color, tcu::IVec2(x,y)))
		{
			error = true;
			errorMask.setPixel(x, y, tcu::RGBA::red());
		}
	}

	if (error)
	{
		// describe the verification logic if we haven't already
		if (!logOnSuccess)
			verifier.logInfo(log);

		log	<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Verification", "Image Verification")
			<< tcu::TestLog::Image("Result", "Result image", resultImage.getAccess())
			<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
	else if (logOnSuccess)
	{
		log << tcu::TestLog::Message << "Image verification passed." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Verification", "Image Verification")
			<< tcu::TestLog::Image("Result", "Result image", resultImage.getAccess())
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}